

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.h
# Opt level: O0

void __thiscall libDAI::MaxPlus::MaxPlus(MaxPlus *this)

{
  DAIAlg<libDAI::FactorGraph> *in_RDI;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(in_RDI);
  (in_RDI->super_InferenceAlgorithm)._vptr_InferenceAlgorithm = (_func_int **)&PTR_clone_00d4e838;
  in_RDI[1].super_InferenceAlgorithm._vptr_InferenceAlgorithm = (_func_int **)0x0;
  *(undefined8 *)
   &in_RDI[1].super_InferenceAlgorithm._properties.
    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
    ._M_t._M_impl = 0;
  *(undefined8 *)
   &in_RDI[1].super_InferenceAlgorithm._properties.
    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  *(_Base_ptr *)
   ((long)&in_RDI[1].super_InferenceAlgorithm._properties.
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Base_ptr *)
   ((long)&in_RDI[1].super_InferenceAlgorithm._properties.
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) = (_Base_ptr)0x0;
  {unnamed_type#1}::MaxPlus((anon_struct_40_5_28472d03_for_Props *)0xbb4c94);
  *(_Base_ptr *)
   ((long)&in_RDI[1].super_InferenceAlgorithm._properties.
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) = (_Base_ptr)0x0;
  in_RDI[1].super_InferenceAlgorithm._properties.
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  memset(&in_RDI[1].super_InferenceAlgorithm._maxdiff,0,0x18);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xbb4cd2);
  memset(&in_RDI[1]._grm.super_GraphicalModel._normType,0,0x18);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)0xbb4cf9);
  memset(&in_RDI[1]._grm._fg._V1.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage,0,0x18);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)0xbb4d20);
  in_RDI[1]._grm._fg._V2.
  super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbb4d3c);
  in_RDI[1]._grm._fg._E12ind.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
  std::__cxx11::
  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::list((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *)0xbb4d58);
  in_RDI[1]._grm._fg._nb1.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xffefffffffffffff;
  *(undefined1 *)
   &in_RDI[1]._grm._fg._nb2.
    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  in_RDI[1]._grm._fg._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in_RDI[1]._grm._fg._nb2.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

MaxPlus() : 
                DAIAlgFG(), Props(), _maxdiff(0.0), _iterations(0UL), _indices(),
                _messages(), _newmessages(), _g(NULL),_k(1),
                _k_th_Val(-DBL_MAX),  writeAnyTimeResults(false),  
                results_f(NULL), timings_f(NULL){}